

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

hash_code __thiscall
llvm::hashing::detail::hash_combine_recursive_helper::combine<long,int>
          (hash_combine_recursive_helper *this,size_t length,char *buffer_ptr,char *buffer_end,
          long *arg,int *args)

{
  char *buffer_ptr_00;
  hash_code hVar1;
  size_t local_28;
  
  local_28 = length;
  buffer_ptr_00 = combine_data<long>(this,&local_28,buffer_ptr,buffer_end,*arg);
  hVar1 = combine<int>(this,local_28,buffer_ptr_00,buffer_end,args);
  return (hash_code)hVar1.value;
}

Assistant:

hash_code combine(size_t length, char *buffer_ptr, char *buffer_end,
                    const T &arg, const Ts &...args) {
    buffer_ptr = combine_data(length, buffer_ptr, buffer_end, get_hashable_data(arg));

    // Recurse to the next argument.
    return combine(length, buffer_ptr, buffer_end, args...);
  }